

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O3

shared_ptr<tchecker::typed_statement_t> __thiscall
tchecker::details::statement_typechecker_t::acquire_typed_statement(statement_typechecker_t *this)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<tchecker::typed_statement_t> sVar2;
  
  puVar1 = (undefined8 *)(in_RSI + 8);
  (this->super_statement_visitor_t)._vptr_statement_visitor_t = *(_func_int ***)(in_RSI + 8);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_00;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *puVar1 = 0;
    *(undefined8 *)(in_RSI + 0x10) = 0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + STMT_TYPE_NOP;
      UNLOCK();
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
      *puVar1 = 0;
      *(undefined8 *)(in_RSI + 0x10) = 0;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00153d4f;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + STMT_TYPE_NOP;
      *puVar1 = 0;
      *(undefined8 *)(in_RSI + 0x10) = 0;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
LAB_00153d4f:
  sVar2.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = in_RDX._M_pi;
  sVar2.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tchecker::typed_statement_t>)
         sVar2.super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_statement_t> acquire_typed_statement()
  {
    auto acquired_typed_stmt = _typed_stmt;
    _typed_stmt = nullptr;
    return acquired_typed_stmt;
  }